

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftp.c
# Opt level: O1

DirHandle * open_directory(char *name,char **errmsg)

{
  DIR *pDVar1;
  DirHandle *pDVar2;
  int *piVar3;
  char *pcVar4;
  
  pDVar1 = opendir(name);
  if (pDVar1 == (DIR *)0x0) {
    piVar3 = __errno_location();
    pcVar4 = strerror(*piVar3);
    *errmsg = pcVar4;
    pDVar2 = (DirHandle *)0x0;
  }
  else {
    pDVar2 = (DirHandle *)safemalloc(1,8,0);
    pDVar2->dir = (DIR *)pDVar1;
  }
  return pDVar2;
}

Assistant:

DirHandle *open_directory(const char *name, const char **errmsg)
{
    DIR *dir;
    DirHandle *ret;

    dir = opendir(name);
    if (!dir) {
        *errmsg = strerror(errno);
        return NULL;
    }

    ret = snew(DirHandle);
    ret->dir = dir;
    return ret;
}